

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::reset_update_rate
          (raw_quasi_adaptive_huffman_data_model *this)

{
  long in_RDI;
  raw_quasi_adaptive_huffman_data_model *unaff_retaddr;
  undefined4 local_14;
  
  *(int *)(in_RDI + 0x48) =
       (*(int *)(in_RDI + 0x40) - *(int *)(in_RDI + 0x44)) + *(int *)(in_RDI + 0x48);
  if (*(uint *)(in_RDI + 0x38) < *(uint *)(in_RDI + 0x48)) {
    rescale(unaff_retaddr);
  }
  if (*(uint *)(in_RDI + 0x40) < 9) {
    local_14 = *(undefined4 *)(in_RDI + 0x40);
  }
  else {
    local_14 = 8;
  }
  *(undefined4 *)(in_RDI + 0x40) = local_14;
  *(undefined4 *)(in_RDI + 0x44) = local_14;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::reset_update_rate()
   {
      m_total_count += (m_update_cycle - m_symbols_until_update);

#ifdef _DEBUG
      uint actual_total = 0;
      for (uint i = 0; i < m_sym_freq.size(); i++)
         actual_total += m_sym_freq[i];
      LZHAM_ASSERT(actual_total == m_total_count);
#endif

      if (m_total_count > m_total_syms)
         rescale();

      m_symbols_until_update = m_update_cycle = LZHAM_MIN(8, m_update_cycle);
   }